

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O2

uchar __thiscall
RegVmLoweredFunction::AllocateRegister
          (RegVmLoweredFunction *this,VmValue *value,uint index,bool freeDelayed)

{
  uchar *puVar1;
  SmallArray<unsigned_char,_8U> *this_00;
  uchar local_19;
  
  if ((value == (VmValue *)0x0) || (value->typeID != 2)) {
    value = (VmValue *)0x0;
  }
  if (freeDelayed) {
    FreeDelayedRegisters(this,(RegVmLoweredBlock *)0x0);
  }
  if (value != (VmValue *)0x0) {
    if ((value->users).count == 0) {
      __assert_fail("!instruction->users.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                    ,0xb2,
                    "unsigned char RegVmLoweredFunction::AllocateRegister(VmValue *, unsigned int, bool)"
                   );
    }
    if (*(char *)(value[1].users.little + 1) == '\x01') {
      puVar1 = SmallArray<unsigned_char,_8U>::operator[]
                         ((SmallArray<unsigned_char,_8U> *)(value[1].users.little + 2),index);
    }
    else {
      if (*(uint *)(value[1].users.little + 3) != index) {
        __assert_fail("instruction->regVmRegisters.size() == index",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                      ,0xb7,
                      "unsigned char RegVmLoweredFunction::AllocateRegister(VmValue *, unsigned int, bool)"
                     );
      }
      this_00 = (SmallArray<unsigned_char,_8U> *)(value[1].users.little + 2);
      local_19 = GetRegister(this);
      SmallArray<unsigned_char,_8U>::push_back(this_00,&local_19);
      puVar1 = SmallArray<unsigned_char,_8U>::back(this_00);
    }
    return *puVar1;
  }
  __assert_fail("instruction",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                ,0xb1,
                "unsigned char RegVmLoweredFunction::AllocateRegister(VmValue *, unsigned int, bool)"
               );
}

Assistant:

unsigned char RegVmLoweredFunction::AllocateRegister(VmValue *value, unsigned index, bool freeDelayed)
{
	VmInstruction *instruction = getType<VmInstruction>(value);

	if(freeDelayed)
		FreeDelayedRegisters(NULL);

	assert(instruction);
	assert(!instruction->users.empty());

	if(instruction->regVmAllocated)
		return instruction->regVmRegisters[index];

	assert(instruction->regVmRegisters.size() == index);

	instruction->regVmRegisters.push_back(GetRegister());

	return instruction->regVmRegisters.back();
}